

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O0

void __thiscall
google::protobuf::TextFormat::Printer::SetDefaultFieldValuePrinter
          (Printer *this,FieldValuePrinter *printer)

{
  FieldValuePrinterWrapper *this_00;
  FieldValuePrinter *printer_local;
  Printer *this_local;
  
  this_00 = (FieldValuePrinterWrapper *)operator_new(0x10);
  anon_unknown_19::FieldValuePrinterWrapper::FieldValuePrinterWrapper(this_00,printer);
  std::
  unique_ptr<const_google::protobuf::TextFormat::FastFieldValuePrinter,_std::default_delete<const_google::protobuf::TextFormat::FastFieldValuePrinter>_>
  ::reset(&this->default_field_value_printer_,(pointer)this_00);
  return;
}

Assistant:

void TextFormat::Printer::SetDefaultFieldValuePrinter(
    const FieldValuePrinter* printer) {
  default_field_value_printer_.reset(new FieldValuePrinterWrapper(printer));
}